

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Random_keys.cpp
# Opt level: O3

void __thiscall
Random_keys::cruzamento6
          (Random_keys *this,RK_Individual *pai1,RK_Individual *pai2,RK_Individual *filho)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  int iVar4;
  long lVar5;
  
  iVar4 = rand();
  switch(iVar4 % 5) {
  case 0:
    iVar4 = filho->number_of_edges;
    if (0 < (long)iVar4) {
      pdVar1 = pai1->weights;
      pdVar2 = pai2->weights;
      pdVar3 = filho->weights;
      lVar5 = 0;
      do {
        pdVar3[lVar5] = (pdVar1[lVar5] + pdVar2[lVar5]) * 0.5;
        lVar5 = lVar5 + 1;
      } while (iVar4 != lVar5);
    }
    break;
  case 1:
    cruzamento2(this,pai1,pai2,filho);
    return;
  case 2:
    cruzamento3(this,pai1,pai2,filho);
    return;
  case 3:
    cruzamento4(this,pai1,pai2,filho);
    return;
  case 4:
    cruzamento5(this,pai1,pai2,filho);
    return;
  }
  return;
}

Assistant:

void Random_keys::cruzamento6(RK_Individual *pai1, RK_Individual *pai2, RK_Individual *filho) {
    int i = rand() % 5;

    if(i==0)
        this->cruzamento1(pai1, pai2, filho);
    if(i==1)
        this->cruzamento2(pai1, pai2, filho);
    if(i==2)
        this->cruzamento3(pai1, pai2, filho);
    if(i==3)
        this->cruzamento4(pai1, pai2, filho);
    if(i==4)
        this->cruzamento5(pai1, pai2, filho);

}